

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRetF.c
# Opt level: O3

Aig_Man_t * Aig_ManRetimeFrontier(Aig_Man_t *p,int nStepsMax)

{
  ulong *puVar1;
  byte *pbVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  Aig_Obj_t *pObj;
  bool bVar5;
  int iVar6;
  Aig_Obj_t *pAVar7;
  Aig_Obj_t *pAVar8;
  Vec_Ptr_t *pVVar9;
  Aig_Man_t *pAVar10;
  uint uVar11;
  long lVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  
  if (p->nRegs < 1) {
    __assert_fail("Aig_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigRetF.c"
                  ,0x81,"Aig_Man_t *Aig_ManRetimeFrontier(Aig_Man_t *, int)");
  }
  Aig_TableClear(p);
  Aig_ManRetimeMark(p);
  iVar14 = p->nRegs;
  if (0 < iVar14) {
    iVar6 = 0;
    do {
      uVar11 = (p->nObjs[3] - iVar14) + iVar6;
      if (((((int)uVar11 < 0) || (p->vCos->nSize <= (int)uVar11)) ||
          (uVar13 = (p->nObjs[2] - iVar14) + iVar6, (int)uVar13 < 0)) ||
         (p->vCis->nSize <= (int)uVar13)) goto LAB_006d64b6;
      puVar3 = (undefined8 *)p->vCos->pArray[uVar11];
      puVar4 = (undefined8 *)p->vCis->pArray[uVar13];
      puVar4[3] = puVar4[3] | 0x10;
      *puVar4 = puVar3;
      *puVar3 = puVar4;
      iVar6 = iVar6 + 1;
      iVar14 = p->nRegs;
    } while (iVar6 < iVar14);
  }
  iVar14 = 0;
  while (pVVar9 = p->vObjs, 0 < pVVar9->nSize) {
    lVar12 = 0;
    bVar5 = false;
    do {
      pObj = (Aig_Obj_t *)pVVar9->pArray[lVar12];
      if (pObj != (Aig_Obj_t *)0x0) {
        uVar11 = (uint)*(ulong *)&pObj->field_0x18 & 7;
        if (((uVar11 != 4) && ((*(ulong *)&pObj->field_0x18 & 0x20) != 0)) &&
           (0xfffffffd < uVar11 - 7)) {
          pAVar7 = Aig_ObjReal_rec(pObj->pFanin0);
          pAVar8 = Aig_ObjReal_rec(pObj->pFanin1);
          if (((*(byte *)((long *)((ulong)pAVar7 & 0xfffffffffffffffe) + 3) & 0x10) != 0) &&
             ((*(byte *)((long *)((ulong)pAVar8 & 0xfffffffffffffffe) + 3) & 0x10) != 0)) {
            uVar11 = (uint)pAVar7 & 1;
            uVar15 = (ulong)(uVar11 & (uint)pAVar8);
            pAVar7 = Aig_And(p,(Aig_Obj_t *)
                               ((ulong)uVar11 ^
                               *(ulong *)(*(long *)((ulong)pAVar7 & 0xfffffffffffffffe) + 8)),
                             (Aig_Obj_t *)
                             ((ulong)((uint)pAVar8 & 1) ^
                             *(ulong *)(*(long *)((ulong)pAVar8 & 0xfffffffffffffffe) + 8)));
            pAVar7->field_0x18 = pAVar7->field_0x18 | 0x20;
            pAVar8 = Aig_ObjCreateCi(p);
            pAVar8->field_0x18 = pAVar8->field_0x18 | 0x10;
            pAVar7 = Aig_ObjCreateCo(p,(Aig_Obj_t *)((ulong)pAVar7 ^ uVar15));
            p->nRegs = p->nRegs + 1;
            (pAVar8->field_0).pNext = pAVar7;
            (pAVar7->field_0).pNext = pAVar8;
            Aig_ObjDisconnect(p,pObj);
            *(ulong *)&pObj->field_0x18 = *(ulong *)&pObj->field_0x18 & 0xfffffffffffffff8 | 4;
            *(ulong *)(p->nObjs + 4) =
                 CONCAT44((int)((ulong)*(undefined8 *)(p->nObjs + 4) >> 0x20) + -1,
                          (int)*(undefined8 *)(p->nObjs + 4) + 1);
            Aig_ObjConnect(p,pObj,(Aig_Obj_t *)(uVar15 ^ (ulong)pAVar8),(Aig_Obj_t *)0x0);
            iVar14 = iVar14 + 1;
            bVar5 = true;
            if (nStepsMax <= iVar14) goto LAB_006d6401;
          }
        }
      }
      lVar12 = lVar12 + 1;
      pVVar9 = p->vObjs;
    } while (lVar12 < pVVar9->nSize);
    if (!bVar5) break;
  }
LAB_006d6401:
  iVar14 = p->nRegs;
  if (0 < iVar14) {
    iVar6 = 0;
    do {
      uVar11 = (p->nObjs[3] - iVar14) + iVar6;
      if (((((int)uVar11 < 0) || (p->vCos->nSize <= (int)uVar11)) ||
          (uVar13 = (p->nObjs[2] - iVar14) + iVar6, (int)uVar13 < 0)) ||
         (p->vCis->nSize <= (int)uVar13)) {
LAB_006d64b6:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      puVar3 = (undefined8 *)p->vCos->pArray[uVar11];
      puVar4 = (undefined8 *)p->vCis->pArray[uVar13];
      puVar1 = puVar4 + 3;
      *puVar1 = *puVar1 & 0xffffffffffffffef;
      *puVar3 = 0;
      *puVar4 = 0;
      iVar6 = iVar6 + 1;
      iVar14 = p->nRegs;
    } while (iVar6 < iVar14);
  }
  pVVar9 = p->vObjs;
  if (0 < pVVar9->nSize) {
    lVar12 = 0;
    do {
      if (pVVar9->pArray[lVar12] != (void *)0x0) {
        pbVar2 = (byte *)((long)pVVar9->pArray[lVar12] + 0x18);
        *pbVar2 = *pbVar2 & 0xdf;
        pVVar9 = p->vObjs;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < pVVar9->nSize);
  }
  Aig_ManSeqCleanup(p);
  pAVar10 = Aig_ManDupOrdered(p);
  return pAVar10;
}

Assistant:

Aig_Man_t * Aig_ManRetimeFrontier( Aig_Man_t * p, int nStepsMax )
{
    Aig_Obj_t * pObj, * pObjNew, * pObjLo, * pObjLo0, * pObjLo1, * pObjLi, * pObjLi0, * pObjLi1;//, * pObjLi0_, * pObjLi1_, * pObjLi0__, * pObjLi1__;
    int i, Counter, fCompl, fChange;
    assert( Aig_ManRegNum(p) > 0 );
    // remove structural hashing table
    Aig_TableClear( p );
    // mark the retimable nodes
    Aig_ManRetimeMark( p );
    // mark the register outputs
    Aig_ManForEachLiLoSeq( p, pObjLi, pObjLo, i )
    {
        pObjLo->fMarkA = 1;
        pObjLo->pNext = pObjLi;
        pObjLi->pNext = pObjLo;
    }
    // go through the nodes and find retimable ones
    Counter = 0;
    fChange = 1;
    while ( fChange )
    {
        fChange = 0;
        Aig_ManForEachNode( p, pObj, i )
        {
            if ( !pObj->fMarkB )
                continue;
            if ( Aig_ObjIsBuf(pObj) )
                continue;
            // get the real inputs of the node (skipping the buffers)
            pObjLo0 = Aig_ObjReal_rec( Aig_ObjChild0(pObj) );
            pObjLo1 = Aig_ObjReal_rec( Aig_ObjChild1(pObj) );
            if ( !Aig_Regular(pObjLo0)->fMarkA || !Aig_Regular(pObjLo1)->fMarkA )
                continue;
            // remember complemented attribute
            fCompl = Aig_IsComplement(pObjLo0) & Aig_IsComplement(pObjLo1);
            // get the register inputs
//            pObjLi0_ = Aig_Regular(pObjLo0)->pNext;
//            pObjLi1_ = Aig_Regular(pObjLo1)->pNext;
//            pObjLi0__ = Aig_ObjChild0(Aig_Regular(pObjLo0)->pNext);
//            pObjLi1__ = Aig_ObjChild0(Aig_Regular(pObjLo1)->pNext);
            pObjLi0 = Aig_NotCond( Aig_ObjChild0(Aig_Regular(pObjLo0)->pNext), Aig_IsComplement(pObjLo0) );
            pObjLi1 = Aig_NotCond( Aig_ObjChild0(Aig_Regular(pObjLo1)->pNext), Aig_IsComplement(pObjLo1) );
            // create new node
            pObjNew = Aig_And( p, pObjLi0, pObjLi1 );
            pObjNew->fMarkB = 1;
            // create new register
            pObjLo = Aig_ObjCreateCi(p);
            pObjLo->fMarkA = 1;
            pObjLi = Aig_ObjCreateCo( p, Aig_NotCond(pObjNew, fCompl) );
            p->nRegs++;
            pObjLo->pNext = pObjLi;
            pObjLi->pNext = pObjLo;
            // add the buffer
            Aig_ObjDisconnect( p, pObj );
            pObj->Type = AIG_OBJ_BUF;
            p->nObjs[AIG_OBJ_AND]--;
            p->nObjs[AIG_OBJ_BUF]++;
            Aig_ObjConnect( p, pObj, Aig_NotCond(pObjLo, fCompl), NULL );
            // create HAIG if defined
            // mark the change
            fChange = 1;
            // check the limit
            if ( ++Counter >= nStepsMax )
            {
                fChange = 0;
                break;
            }
        }
    }
    // clean the markings
    Aig_ManForEachLiLoSeq( p, pObjLi, pObjLo, i )
    {
        pObjLo->fMarkA = 0;
        pObjLo->pNext = pObjLi->pNext = NULL;
    }
    Aig_ManForEachObj( p, pObj, i )
        pObj->fMarkB = 0;
    // remove useless registers
    Aig_ManSeqCleanup( p );
    // rehash the nodes
    return Aig_ManDupOrdered( p ); 
}